

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

void __thiscall HandleManager::tokenLoggedOut(HandleManager *this,CK_SLOT_ID slotID)

{
  bool bVar1;
  pointer ppVar2;
  CK_SLOT_ID in_RSI;
  long in_RDI;
  Handle *h;
  iterator it;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff78;
  MutexLocker *in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> local_28 [3];
  CK_SLOT_ID local_10;
  
  local_10 = in_RSI;
  MutexLocker::MutexLocker(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::_Rb_tree_iterator(local_28);
  local_30 = (_Base_ptr)
             std::
             map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
             ::begin((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
                      *)in_stack_ffffffffffffff78);
  local_28[0]._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
         ::end((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
                *)in_stack_ffffffffffffff78);
    bVar1 = std::operator!=(local_28,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)0x1cd0bb);
    if ((((ppVar2->second).kind == 2) && (local_10 == (ppVar2->second).slotID)) &&
       (((ppVar2->second).isPrivate & 1U) != 0)) {
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)0x1cd112);
      std::
      map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
      ::erase((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
               *)in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->_vptr_Mutex);
      in_stack_ffffffffffffff80 = (MutexLocker *)(in_RDI + 0x10);
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)
                 in_stack_ffffffffffffff88._M_node,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      in_stack_ffffffffffffff88 =
           std::
           map<unsigned_long,Handle,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
           ::erase_abi_cxx11_((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
                               *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
    }
    else {
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)
                 in_stack_ffffffffffffff80);
    }
  }
  MutexLocker::~MutexLocker(in_stack_ffffffffffffff80);
  return;
}

Assistant:

void HandleManager::tokenLoggedOut(const CK_SLOT_ID slotID)
{
	MutexLocker lock(handlesMutex);

	// Erase all private "token object" or "session object" handles for a given slot id.
	std::map< CK_ULONG, Handle>::iterator it;
	for (it = handles.begin(); it != handles.end(); ) {
		Handle &h = it->second;
		if (CKH_OBJECT == h.kind && slotID == h.slotID && h.isPrivate) {
			// A private object is present for the given slotID so we need to remove it.
			objects.erase(it->second.object);
			// Iterator post-incrementing (it++) will return a copy of the original it (which points to handle to be deleted).
			handles.erase(it++);
			continue;
		}
		++it;
	}
}